

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::log<char_const(&)[45],__0,int&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [45],
               anon_enum_32 *params_1,int *params_2)

{
  undefined4 in_register_00000014;
  anon_enum_32 *params_00;
  int *params_01;
  long lVar1;
  undefined4 in_register_00000034;
  String argValues [3];
  
  str<char_const(&)[45]>
            (argValues,(kj *)"failed: expected (SI_USER) == (info.si_code)",
             (char (*) [45])CONCAT44(in_register_00000014,severity));
  str<__0&>(argValues + 1,(kj *)CONCAT44(in_register_00000034,line),params_00);
  str<int&>(argValues + 2,(kj *)CONCAT44(in_register_00000014,severity),params_01);
  logInternal((Debug *)
              "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              ,(char *)((ulong)file & 0xffffffff),2,0x328c7a,(char *)argValues,
              (ArrayPtr<kj::String>)argValues[0].content._0_16_);
  lVar1 = 0x30;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}